

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void LogLuv32toXYZ(uint32_t p,float *XYZ)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = LogL16toY((int)p >> 0x10);
  if (dVar1 <= 0.0) {
    XYZ[2] = 0.0;
    XYZ[0] = 0.0;
    XYZ[1] = 0.0;
  }
  else {
    dVar2 = ((double)(p >> 8 & 0xff) + 0.5) * 0.0024390243902439024;
    dVar3 = ((double)(p & 0xff) + 0.5) * 0.0024390243902439024;
    dVar4 = 1.0 / (dVar2 * 6.0 + dVar3 * -16.0 + 12.0);
    dVar2 = dVar2 * 9.0 * dVar4;
    dVar4 = dVar3 * 4.0 * dVar4;
    *XYZ = (float)((dVar2 / dVar4) * dVar1);
    XYZ[1] = (float)dVar1;
    XYZ[2] = (float)((((1.0 - dVar2) - dVar4) / dVar4) * dVar1);
  }
  return;
}

Assistant:

void
    LogLuv32toXYZ(uint32_t p, float *XYZ)
{
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL16toY((int)p >> 16);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    u = 1. / UVSCALE * ((p >> 8 & 0xff) + .5);
    v = 1. / UVSCALE * ((p & 0xff) + .5);
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}